

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O0

size_t __thiscall CLI::App::remaining_size(App *this,bool recurse)

{
  bool bVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  reference this_00;
  pointer this_01;
  size_t sVar4;
  App_p *sub;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
  *__range3;
  size_t local_20;
  size_t count;
  bool recurse_local;
  App *this_local;
  
  cVar2 = ::std::
          begin<std::vector<std::pair<CLI::detail::Classifer,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifer,std::__cxx11::string>>>>
                    (&this->missing_);
  cVar3 = ::std::
          end<std::vector<std::pair<CLI::detail::Classifer,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifer,std::__cxx11::string>>>>
                    (&this->missing_);
  local_20 = ::std::
             count_if<__gnu_cxx::__normal_iterator<std::pair<CLI::detail::Classifer,std::__cxx11::string>const*,std::vector<std::pair<CLI::detail::Classifer,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifer,std::__cxx11::string>>>>,CLI::App::remaining_size(bool)const::_lambda(std::pair<CLI::detail::Classifer,std::__cxx11::string>const&)_1_>
                       (cVar2._M_current,cVar3._M_current);
  if (recurse) {
    __end3 = std::
             vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
             ::begin(&this->subcommands_);
    sub = (App_p *)std::
                   vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
                   ::end(&this->subcommands_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_*,_std::vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>_>
                                       *)&sub), bVar1) {
      this_00 = __gnu_cxx::
                __normal_iterator<const_std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_*,_std::vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>_>
                ::operator*(&__end3);
      this_01 = std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>::operator->(this_00);
      sVar4 = remaining_size(this_01,recurse);
      local_20 = sVar4 + local_20;
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_*,_std::vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>_>
      ::operator++(&__end3);
    }
  }
  return local_20;
}

Assistant:

size_t remaining_size(bool recurse = false) const {
        size_t count = std::count_if(
            std::begin(missing_), std::end(missing_), [](const std::pair<detail::Classifer, std::string> &val) {
                return val.first != detail::Classifer::POSITIONAL_MARK;
            });
        if(recurse) {
            for(const App_p &sub : subcommands_) {
                count += sub->remaining_size(recurse);
            }
        }
        return count;
    }